

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int elf_uncompress_lzma(backtrace_state *state,uchar *compressed,size_t compressed_size,
                       backtrace_error_callback error_callback,void *data,uchar **uncompressed,
                       size_t *uncompressed_size)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  backtrace_state *state_00;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  uchar *puVar11;
  backtrace_error_callback p_Var12;
  uchar **buf;
  char cVar13;
  byte bVar14;
  size_t len;
  size_t len_00;
  size_t len_01;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  ulong uVar15;
  size_t __n;
  size_t extraout_RDX_03;
  uchar **ppuVar16;
  uint16_t *puVar17;
  uchar **extraout_RDX_04;
  uchar **extraout_RDX_05;
  uchar **extraout_RDX_06;
  size_t sVar18;
  uchar *puVar19;
  uchar *puVar20;
  uchar **ppuVar21;
  void *pvVar22;
  uint uVar23;
  long lVar24;
  uchar **ppuVar25;
  uint uVar26;
  uint uVar27;
  uchar *puVar28;
  uint16_t *puVar29;
  uchar *puVar30;
  bool bVar31;
  uint64_t local_138;
  uint64_t local_130;
  uint64_t local_128;
  uint64_t index_compressed_size;
  uint64_t index_uncompressed_size;
  uint16_t *local_110;
  uchar **local_108;
  ulong local_100;
  uint16_t *local_f8;
  uchar **local_f0;
  ulong local_e8;
  ulong local_e0;
  uchar **local_d8;
  uint local_d0;
  int local_cc;
  uchar *local_c8;
  backtrace_error_callback local_c0;
  void *local_b8;
  uint16_t *local_b0;
  uint local_a8;
  uint local_a4;
  backtrace_state *local_a0;
  uchar **local_98;
  uchar **local_90;
  uchar *local_88;
  uchar **local_80;
  uint16_t *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  uchar *local_60;
  uint local_58;
  uint local_54;
  uchar **local_50;
  uchar *local_48;
  uchar *local_40;
  uint local_38;
  uint32_t local_34;
  
  if (compressed_size < 0x18) {
    return 0;
  }
  local_48 = (uchar *)compressed_size;
  iVar8 = bcmp(compressed,anon_var_dwarf_5a79f,6);
  if (iVar8 != 0) {
    return 0;
  }
  if (compressed[6] != '\0') {
    return 0;
  }
  bVar2 = compressed[7];
  if (7 < bVar2) {
    return 0;
  }
  local_80 = uncompressed;
  uVar9 = elf_crc32((int)compressed + 6,(uchar *)0x2,len);
  puVar19 = local_48;
  if (uVar9 != *(uint32_t *)(compressed + 8)) {
    return 0;
  }
  if (*(short *)(compressed + -2 + (long)local_48) != 0x5a59) {
    return 0;
  }
  if ((local_48 + (long)compressed)[-4] != '\0') {
    return 0;
  }
  if ((local_48 + (long)compressed)[-3] != bVar2) {
    return 0;
  }
  puVar11 = local_48 + (long)compressed;
  lVar24 = (long)*(int *)(puVar11 + -8);
  local_d0 = (uint)bVar2;
  local_c0 = error_callback;
  local_a0 = state;
  uVar9 = elf_crc32((uint32_t)(puVar11 + -8),(uchar *)0x6,len_00);
  puVar30 = local_48;
  if (uVar9 != *(uint32_t *)(puVar11 + -0xc)) {
    return 0;
  }
  if (puVar19 + -0xc < (uchar *)(lVar24 * 4 + 0x10U)) {
    return 0;
  }
  puVar19 = puVar19 + lVar24 * -4;
  if ((compressed + -0x10)[(long)puVar19] != '\0') {
    return 0;
  }
  puVar11 = puVar19 + -0x10;
  if ((compressed + 1)[(long)puVar11] != '\x01') {
    if ((compressed + 1)[(long)puVar11] == '\0') {
      *local_80 = (uchar *)0x0;
      *uncompressed_size = 0;
      return 1;
    }
    return 0;
  }
  local_40 = puVar19 + -0xe;
  local_b8 = data;
  iVar8 = elf_lzma_varint(compressed,(size_t)local_48,(size_t *)&local_40,&local_128);
  if (iVar8 == 0) {
    return 0;
  }
  iVar8 = elf_lzma_varint(compressed,(size_t)puVar30,(size_t *)&local_40,&index_compressed_size);
  if (iVar8 == 0) {
    return 0;
  }
  puVar20 = (uchar *)((ulong)(local_40 + 3) & 0xfffffffffffffffc);
  uVar9 = elf_crc32(((int)puVar19 + (int)compressed) - 0x10,puVar20 + -(long)puVar11,len_01);
  state_00 = local_a0;
  pvVar22 = local_b8;
  p_Var12 = local_c0;
  if (uVar9 != *(uint32_t *)(compressed + (long)puVar20)) {
    return 0;
  }
  if (puVar20 != puVar30 + -0x10) {
    return 0;
  }
  local_c8 = compressed;
  local_60 = (uchar *)tcmalloc_backtrace_alloc(local_a0,index_compressed_size,local_c0,local_b8);
  if (local_60 == (uchar *)0x0) {
    return 0;
  }
  *local_80 = local_60;
  *uncompressed_size = index_compressed_size;
  local_b0 = (uint16_t *)tcmalloc_backtrace_alloc(state_00,0x6e6c,p_Var12,pvVar22);
  puVar19 = local_c8;
  if (local_b0 != (uint16_t *)0x0) {
    local_80 = (uchar **)index_compressed_size;
    puVar30 = (uchar *)((ulong)local_c8[0xc] * 4);
    p_Var12 = local_c0;
    pvVar22 = local_b8;
    index_uncompressed_size = (uint64_t)puVar11;
    if ((puVar30 + 0x10 <= local_48) && (bVar2 = local_c8[0xd], (bVar2 & 0x3c) == 0)) {
      if ((bVar2 & 0x40) == 0) {
        puVar11 = (uchar *)0xe;
        sVar18 = extraout_RDX;
      }
      else {
        local_40 = (uchar *)0xe;
        iVar8 = elf_lzma_varint(local_c8,(size_t)local_48,(size_t *)&local_40,&local_138);
        puVar11 = local_40;
        p_Var12 = local_c0;
        sVar18 = extraout_RDX_00;
        index_compressed_size = (uint64_t)local_80;
        pvVar22 = local_b8;
        if (iVar8 == 0) goto LAB_0012320c;
      }
      if ((((-1 < (char)bVar2) ||
           (local_40 = puVar11,
           iVar8 = elf_lzma_varint(puVar19,(size_t)local_48,(size_t *)&local_40,&local_130),
           puVar11 = local_40, p_Var12 = local_c0, sVar18 = extraout_RDX_01,
           index_compressed_size = (uint64_t)local_80, pvVar22 = local_b8, iVar8 != 0)) &&
          (p_Var12 = local_c0, index_compressed_size = (uint64_t)local_80, pvVar22 = local_b8,
          (bVar2 & 3) == 0)) &&
         (((puVar11 + 2 < puVar30 + 0x10 && (puVar19[(long)puVar11] == '!')) &&
          (((puVar19 + 1)[(long)puVar11] == '\x01' && ((puVar19 + 2)[(long)puVar11] < 0x29)))))) {
        puVar11 = puVar11 + 3;
        puVar20 = puVar30 + 0xc;
        puVar28 = puVar11;
        if (puVar11 < puVar20) {
          puVar28 = puVar20;
        }
        do {
          if (puVar20 <= puVar11) {
            uVar9 = elf_crc32((int)puVar19 + 0xc,puVar30,sVar18);
            p_Var12 = local_c0;
            index_compressed_size = (uint64_t)local_80;
            pvVar22 = local_b8;
            if (uVar9 == *(uint32_t *)(puVar19 + (long)puVar28)) {
              local_110 = local_b0 + 0x736;
              local_f8 = local_b0 + 0x322;
              local_50 = (uchar **)0x0;
              local_a8 = 0;
              local_e8 = 0;
              local_e0 = 0;
              ppuVar25 = (uchar **)0x0;
              buf = (uchar **)0x0;
              sVar18 = extraout_RDX_02;
              puVar30 = puVar28 + 4;
              local_78 = local_f8;
              uVar10 = local_34;
              puVar11 = local_48;
              goto LAB_00123293;
            }
            break;
          }
          puVar1 = puVar19 + (long)puVar11;
          puVar11 = puVar11 + 1;
        } while (*puVar1 == '\0');
      }
    }
  }
  goto LAB_0012320c;
LAB_00123293:
  p_Var12 = local_c0;
  pvVar22 = local_b8;
  index_compressed_size = (uint64_t)local_80;
  if (puVar30 < puVar11) {
    bVar2 = puVar19[(long)puVar30];
    if (bVar2 == 0) {
      puVar30 = puVar30 + 1;
      uVar10 = 0xffffffff;
      goto LAB_00123af5;
    }
    if (0xdf < bVar2) {
      ppuVar25 = buf;
    }
    if (bVar2 == 1) {
      ppuVar25 = buf;
    }
    if ((char)bVar2 < '\0') {
      local_34 = 0xffffffff;
      puVar20 = puVar30 + 5;
      if (puVar11 <= puVar20) goto LAB_0012320c;
      bVar3 = (puVar19 + 1)[(long)puVar30];
      bVar4 = (puVar19 + 2)[(long)puVar30];
      uVar5 = *(ushort *)(puVar19 + 3 + (long)puVar30);
      if (bVar2 < 0xc0) {
        if (0x9f < bVar2) goto LAB_001233f2;
      }
      else {
        bVar14 = puVar19[(long)puVar20];
        if (0xe0 < bVar14) goto LAB_0012320c;
        bVar6 = bVar14;
        if (bVar14 < 0x2d) {
          bVar6 = 0x2c;
        }
        cVar13 = bVar6 - bVar6 % 0x2d;
        bVar7 = bVar14 - cVar13;
        if (8 < bVar7) {
          bVar7 = 9;
        }
        bVar7 = (bVar14 - (bVar7 + cVar13)) + 8;
        bVar14 = bVar7 % 9 + (bVar14 - (cVar13 + bVar7));
        local_e8 = (ulong)(bVar7 / 9);
        local_e0 = (ulong)bVar14;
        if (4 < (uint)(bVar7 / 9) + (uint)bVar14) goto LAB_0012320c;
        puVar20 = puVar30 + 6;
        local_a8 = CONCAT11(bVar6 % 0x2d,bVar6 / 0x2d) & 0xff;
LAB_001233f2:
        for (lVar24 = 0; lVar24 != 0x3736; lVar24 = lVar24 + 1) {
          local_b0[lVar24] = 0x400;
        }
        local_68 = 0;
        local_58 = 0;
        local_54 = 0;
        local_78 = (uint16_t *)0x0;
        local_50 = (uchar **)0x0;
      }
      local_34 = 0xffffffff;
      puVar11 = puVar20 + 5;
      if (local_48 < puVar11) goto LAB_0012320c;
      uVar10 = *(uint *)(puVar19 + 1 + (long)puVar20);
      local_38 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
      ;
      local_cc = 8 - (int)local_e0;
      ppuVar16 = (uchar **)(ulong)(uint)~(-1 << ((byte)local_e8 & 0x1f));
      local_100 = local_e0 & 0xffffffff;
      ppuVar21 = (uchar **)
                 ((long)buf +
                 (ulong)bVar4 + (ulong)bVar3 * 0x100 + (ulong)((bVar2 & 0x1f) << 0x10) + 1);
      puVar30 = puVar11 + (ulong)(ushort)(uVar5 << 8 | uVar5 >> 8) + 1;
      uVar10 = ~(-1 << ((byte)local_a8 & 0x1f));
      local_108 = ppuVar16;
      local_40 = puVar11;
      while ((puVar17 = local_b0, local_40 < puVar30 && (buf != ppuVar21))) {
        local_98 = (uchar **)((long)buf - (long)ppuVar25);
        local_a4 = (uint)local_98 & uVar10;
        uVar26 = (int)local_50 * 0x10 + local_a4;
        local_90 = ppuVar21;
        local_88 = puVar30;
        local_6c = uVar10;
        iVar8 = elf_lzma_bit(puVar19,(size_t)local_48,local_b0 + uVar26,(size_t *)&local_40,
                             &local_34,&local_38);
        puVar11 = local_48;
        local_d8 = buf;
        if (iVar8 == 0) {
          if (buf == (uchar **)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (uint)(local_60 + -1)[(long)buf];
          }
          puVar17 = local_110 +
                    (((ulong)((uint)local_98 & (uint)local_108) << ((byte)local_100 & 0x3f)) +
                    (ulong)(uVar10 >> ((byte)local_cc & 0x1f))) * 0x300;
          local_f0 = ppuVar25;
          if ((uint)local_50 < 7) {
            uVar9 = elf_lzma_integer(puVar19,(size_t)local_48,puVar17,8,(size_t *)&local_40,
                                     &local_34,&local_38);
          }
          else {
            uVar10 = 0;
            if ((uchar **)(ulong)((int)local_78 + 1) <= buf) {
              uVar10 = (uint)(local_60 + (long)buf)[~((ulong)local_78 & 0xffffffff)] * 2;
            }
            uVar26 = 0x100;
            uVar27 = 1;
            do {
              uVar23 = uVar26 & uVar10;
              uVar10 = uVar10 * 2;
              iVar8 = elf_lzma_bit(local_c8,(size_t)local_48,puVar17 + (uVar26 + uVar27 + uVar23),
                                   (size_t *)&local_40,&local_34,&local_38);
              if (iVar8 != 0) {
                uVar26 = 0;
              }
              uVar9 = iVar8 + uVar27 * 2;
              uVar26 = uVar26 ^ uVar23;
              bVar31 = uVar27 < 0x80;
              uVar27 = uVar9;
            } while (bVar31);
          }
          p_Var12 = local_c0;
          index_compressed_size = (uint64_t)local_80;
          pvVar22 = local_b8;
          if (local_80 <= local_d8) goto LAB_0012320c;
          local_60[(long)local_d8] = (uchar)uVar9;
          ppuVar16 = (uchar **)((long)local_d8 + 1);
          uVar26 = (uint)local_50;
          ppuVar21 = local_90;
          buf = ppuVar16;
          puVar30 = local_88;
          puVar19 = local_c8;
          ppuVar25 = local_f0;
          uVar10 = local_6c;
          local_50 = (uchar **)0x0;
          if (3 < uVar26) {
            if (uVar26 < 10) {
              uVar26 = uVar26 - 3;
            }
            else {
              uVar26 = uVar26 - 6;
            }
            local_50 = (uchar **)(ulong)uVar26;
          }
        }
        else {
          iVar8 = elf_lzma_bit(puVar19,(size_t)local_48,puVar17 + ((uint)local_50 + 0xc0),
                               (size_t *)&local_40,&local_34,&local_38);
          if (iVar8 == 0) {
            local_64 = (uint)(6 < (uint)local_50) * 3 + 7;
            uVar9 = elf_lzma_len(puVar19,(size_t)puVar11,puVar17,0,local_a4,(size_t *)&local_40,
                                 &local_34,&local_38);
            local_50 = (uchar **)CONCAT44(local_50._4_4_,uVar9);
            uVar10 = uVar9 * 0x40 + 0x130;
            if (5 < uVar9) {
              uVar10 = 0x270;
            }
            uVar26 = elf_lzma_integer(puVar19,(size_t)puVar11,puVar17 + uVar10,6,(size_t *)&local_40
                                      ,&local_34,&local_38);
            uVar10 = local_58;
            puVar30 = local_88;
            if (uVar26 < 4) {
              local_58 = local_54;
              local_54 = (uint)local_78;
            }
            else {
              uVar27 = uVar26 & 1 | 2;
              if (uVar26 < 0xe) {
                uVar9 = (uVar26 >> 1) - 1;
                iVar8 = uVar27 << ((byte)uVar9 & 0x1f);
                puVar17 = local_b0 + ((iVar8 - uVar26) + 0x2af);
              }
              else {
                iVar8 = (uVar26 >> 1) - 5;
                while (bVar31 = iVar8 != 0, iVar8 = iVar8 + -1, bVar31) {
                  if (local_40 < local_48 && local_34 < 0x1000000) {
                    local_34 = local_34 << 8;
                    local_38 = local_38 << 8 | (uint)puVar19[(long)local_40];
                    local_40 = local_40 + 1;
                  }
                  local_34 = local_34 >> 1;
                  uVar26 = (int)(local_38 - local_34) >> 0x1f;
                  uVar27 = uVar26 + uVar27 * 2 + 1;
                  local_38 = (local_38 - local_34) + (uVar26 & local_34);
                }
                iVar8 = uVar27 << 4;
                uVar9 = 4;
                puVar17 = local_f8;
              }
              uVar9 = elf_lzma_reverse_integer
                                (puVar19,(size_t)local_48,puVar17,uVar9,(size_t *)&local_40,
                                 &local_34,&local_38);
              local_58 = local_54;
              local_54 = (uint)local_78;
              uVar26 = uVar9 + iVar8;
            }
            local_68 = uVar10;
            local_78 = (uint16_t *)(ulong)uVar26;
            ppuVar16 = (uchar **)((ulong)local_50 & 0xffffffff);
          }
          else {
            iVar8 = elf_lzma_bit(puVar19,(size_t)puVar11,puVar17 + ((uint)local_50 + 0xcc),
                                 (size_t *)&local_40,&local_34,&local_38);
            if (iVar8 == 0) {
              iVar8 = elf_lzma_bit(puVar19,(size_t)puVar11,puVar17 + (uVar26 + 0xf0),
                                   (size_t *)&local_40,&local_34,&local_38);
              local_64 = iVar8 == 0 | 8;
              if (6 < (uint)local_50) {
                local_64 = 0xb;
              }
              puVar29 = (uint16_t *)((ulong)local_78 & 0xffffffff);
              ppuVar16 = (uchar **)0x1;
              puVar30 = local_88;
              if (iVar8 == 0) goto LAB_001239bc;
            }
            else {
              iVar8 = elf_lzma_bit(puVar19,(size_t)puVar11,puVar17 + ((int)local_50 + 0xd8),
                                   (size_t *)&local_40,&local_34,&local_38);
              uVar10 = (uint)local_50;
              if (iVar8 != 0) {
                iVar8 = elf_lzma_bit(puVar19,(size_t)local_48,puVar17 + (uVar10 + 0xe4),
                                     (size_t *)&local_40,&local_34,&local_38);
                uVar26 = local_58;
                if (iVar8 == 0) {
                  uVar26 = local_68;
                  local_68 = local_58;
                }
                local_58 = local_54;
                local_54 = local_68;
                local_68 = uVar26;
              }
              puVar29 = (uint16_t *)(ulong)local_54;
              local_64 = (uint)(6 < uVar10) * 3 + 8;
              local_54 = (uint)local_78;
            }
            puVar30 = local_88;
            uVar9 = elf_lzma_len(puVar19,(size_t)local_48,puVar17,1,local_a4,(size_t *)&local_40,
                                 &local_34,&local_38);
            ppuVar16 = (uchar **)(ulong)uVar9;
            local_78 = puVar29;
          }
LAB_001239bc:
          uVar10 = (int)local_78 + 1;
          local_50 = (uchar **)(ulong)uVar10;
          p_Var12 = local_c0;
          index_compressed_size = (uint64_t)local_80;
          pvVar22 = local_b8;
          if (local_98 < local_50) goto LAB_0012320c;
          buf = (uchar **)((long)local_d8 + (long)ppuVar16);
          if (local_80 < buf) goto LAB_0012320c;
          if ((int)local_78 == 0) {
            memset(local_60 + (long)local_d8,(uint)(local_60 + -1)[(long)local_d8],(size_t)ppuVar16)
            ;
            local_78 = (uint16_t *)0x0;
            ppuVar16 = extraout_RDX_05;
          }
          else if (uVar10 < (uint)ppuVar16) {
            local_98 = (uchar **)-((ulong)local_78 & 0xffffffff);
            buf = local_d8;
            ppuVar21 = ppuVar16;
            while (uVar10 = (uint)ppuVar21, puVar30 = local_88, uVar10 != 0) {
              ppuVar16 = local_50;
              if (uVar10 < (uint)local_50) {
                ppuVar16 = ppuVar21;
              }
              memcpy(local_60 + (long)buf,local_60 + (long)buf + (long)local_98 + -1,
                     (ulong)ppuVar16 & 0xffffffff);
              buf = (uchar **)((long)buf + ((ulong)ppuVar16 & 0xffffffff));
              ppuVar21 = (uchar **)(ulong)(uVar10 - (int)ppuVar16);
              ppuVar16 = extraout_RDX_04;
            }
          }
          else {
            memcpy((uchar *)((long)local_d8 + (long)local_60),
                   (uchar *)((long)local_d8 + (long)local_60) + ~((ulong)local_78 & 0xffffffff),
                   (size_t)ppuVar16);
            ppuVar16 = extraout_RDX_06;
          }
          ppuVar21 = local_90;
          uVar10 = local_6c;
          local_50 = (uchar **)(ulong)local_64;
        }
      }
      sVar18 = CONCAT71((int7)((ulong)ppuVar16 >> 8),local_48 <= local_40 || 0xffffff < local_34);
      puVar30 = local_40;
      uVar10 = local_34;
      puVar11 = local_48;
      if (local_48 > local_40 && 0xffffff >= local_34) {
        local_34 = local_34 << 8;
        local_38 = (uint)puVar19[(long)local_40] | local_38 << 8;
        puVar30 = local_40 + 1;
        local_40 = puVar30;
        uVar10 = local_34;
      }
    }
    else {
      if ((2 < bVar2) || (puVar20 = puVar30 + 3, puVar11 < puVar20)) {
LAB_00123ae6:
        local_34 = 0xffffffff;
        goto LAB_0012320c;
      }
      uVar15 = (ulong)(ushort)(*(ushort *)(puVar19 + 1 + (long)puVar30) << 8 |
                              *(ushort *)(puVar19 + 1 + (long)puVar30) >> 8);
      if (puVar11 < puVar20 + uVar15 + 1) goto LAB_00123ae6;
      __n = uVar15 + 1;
      ppuVar16 = (uchar **)(__n + (long)buf);
      if (local_80 < ppuVar16) goto LAB_00123ae6;
      memcpy((uchar *)((long)buf + (long)local_60),puVar20 + (long)puVar19,__n);
      sVar18 = extraout_RDX_03;
      buf = ppuVar16;
      puVar30 = puVar20 + uVar15 + 1;
      uVar10 = 0xffffffff;
    }
    goto LAB_00123293;
  }
LAB_00123af5:
  puVar20 = (uchar *)((ulong)(puVar30 + 3) & 0xfffffffffffffffc);
  local_34 = uVar10;
  if (puVar11 < puVar20) goto LAB_0012320c;
  puVar11 = puVar20;
  if (local_d0 != 0) {
    if (local_d0 == 10) {
      puVar11 = puVar20 + 0x20;
    }
    else {
      if (local_d0 != 4) {
        if (((local_d0 != 1) || (puVar11 = puVar20 + 4, local_48 < puVar11)) ||
           (uVar9 = elf_crc32((uint32_t)local_60,(uchar *)buf,sVar18), p_Var12 = local_c0,
           index_compressed_size = (uint64_t)local_80, pvVar22 = local_b8,
           uVar9 != CONCAT13(puVar19[(ulong)(puVar30 + 3) | 3],
                             CONCAT12((puVar19 + 2)[(long)puVar20],
                                      *(undefined2 *)(puVar19 + (long)puVar20)))))
        goto LAB_0012320c;
        goto LAB_00123b88;
      }
      puVar11 = puVar20 + 8;
    }
    if (local_48 < puVar11) goto LAB_0012320c;
  }
LAB_00123b88:
  p_Var12 = local_c0;
  index_compressed_size = (uint64_t)local_80;
  pvVar22 = local_b8;
  if ((puVar11 + -0xc == (uchar *)(local_128 + 3 & 0xfffffffffffffffc)) &&
     (puVar11 == (uchar *)index_uncompressed_size)) {
    return 1;
  }
LAB_0012320c:
  tcmalloc_backtrace_free(local_a0,local_60,index_compressed_size,p_Var12,pvVar22);
  return 0;
}

Assistant:

static int
elf_uncompress_lzma (struct backtrace_state *state,
		     const unsigned char *compressed, size_t compressed_size,
		     backtrace_error_callback error_callback, void *data,
		     unsigned char **uncompressed, size_t *uncompressed_size)
{
  size_t header_size;
  size_t footer_size;
  unsigned char check;
  uint32_t computed_crc;
  uint32_t stream_crc;
  size_t offset;
  size_t index_size;
  size_t footer_offset;
  size_t index_offset;
  uint64_t index_compressed_size;
  uint64_t index_uncompressed_size;
  unsigned char *mem;
  uint16_t *probs;
  size_t compressed_block_size;

  /* The format starts with a stream header and ends with a stream
     footer.  */
  header_size = 12;
  footer_size = 12;
  if (unlikely (compressed_size < header_size + footer_size))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* The stream header starts with a magic string.  */
  if (unlikely (memcmp (compressed, "\375" "7zXZ\0", 6) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Next come stream flags.  The first byte is zero, the second byte
     is the check.  */
  if (unlikely (compressed[6] != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  check = compressed[7];
  if (unlikely ((check & 0xf8) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Next comes a CRC of the stream flags.  */
  computed_crc = elf_crc32 (0, compressed + 6, 2);
  stream_crc = ((uint32_t)compressed[8]
		| ((uint32_t)compressed[9] << 8)
		| ((uint32_t)compressed[10] << 16)
		| ((uint32_t)compressed[11] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Now that we've parsed the header, parse the footer, so that we
     can get the uncompressed size.  */

  /* The footer ends with two magic bytes.  */

  offset = compressed_size;
  if (unlikely (memcmp (compressed + offset - 2, "YZ", 2) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 2;

  /* Before that are the stream flags, which should be the same as the
     flags in the header.  */
  if (unlikely (compressed[offset - 2] != 0
		|| compressed[offset - 1] != check))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 2;

  /* Before that is the size of the index field, which precedes the
     footer.  */
  index_size = (compressed[offset - 4]
		| (compressed[offset - 3] << 8)
		| (compressed[offset - 2] << 16)
		| (compressed[offset - 1] << 24));
  index_size = (index_size + 1) * 4;
  offset -= 4;

  /* Before that is a footer CRC.  */
  computed_crc = elf_crc32 (0, compressed + offset, 6);
  stream_crc = ((uint32_t)compressed[offset - 4]
		| ((uint32_t)compressed[offset - 3] << 8)
		| ((uint32_t)compressed[offset - 2] << 16)
		| ((uint32_t)compressed[offset - 1] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 4;

  /* The index comes just before the footer.  */
  if (unlikely (offset < index_size + header_size))
    {
      elf_uncompress_failed ();
      return 0;
    }

  footer_offset = offset;
  offset -= index_size;
  index_offset = offset;

  /* The index starts with a zero byte.  */
  if (unlikely (compressed[offset] != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  ++offset;

  /* Next is the number of blocks.  We expect zero blocks for an empty
     stream, and otherwise a single block.  */
  if (unlikely (compressed[offset] == 0))
    {
      *uncompressed = NULL;
      *uncompressed_size = 0;
      return 1;
    }
  if (unlikely (compressed[offset] != 1))
    {
      elf_uncompress_failed ();
      return 0;
    }
  ++offset;

  /* Next is the compressed size and the uncompressed size.  */
  if (!elf_lzma_varint (compressed, compressed_size, &offset,
			&index_compressed_size))
    return 0;
  if (!elf_lzma_varint (compressed, compressed_size, &offset,
			&index_uncompressed_size))
    return 0;

  /* Pad to a four byte boundary.  */
  offset = (offset + 3) &~ (size_t) 3;

  /* Next is a CRC of the index.  */
  computed_crc = elf_crc32 (0, compressed + index_offset,
			    offset - index_offset);
  stream_crc = ((uint32_t)compressed[offset]
		| ((uint32_t)compressed[offset + 1] << 8)
		| ((uint32_t)compressed[offset + 2] << 16)
		| ((uint32_t)compressed[offset + 3] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset += 4;

  /* We should now be back at the footer.  */
  if (unlikely (offset != footer_offset))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Allocate space to hold the uncompressed data.  If we succeed in
     uncompressing the LZMA data, we never free this memory.  */
  mem = (unsigned char *) backtrace_alloc (state, index_uncompressed_size,
					   error_callback, data);
  if (unlikely (mem == NULL))
    return 0;
  *uncompressed = mem;
  *uncompressed_size = index_uncompressed_size;

  /* Allocate space for probabilities.  */
  probs = ((uint16_t *)
	   backtrace_alloc (state,
			    LZMA_PROB_TOTAL_COUNT * sizeof (uint16_t),
			    error_callback, data));
  if (unlikely (probs == NULL))
    {
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  /* Uncompress the block, which follows the header.  */
  offset = 12;
  if (!elf_uncompress_lzma_block (compressed, compressed_size, check, probs,
				  mem, index_uncompressed_size, &offset))
    {
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  compressed_block_size = offset - 12;
  if (unlikely (compressed_block_size
		!= ((index_compressed_size + 3) &~ (size_t) 3)))
    {
      elf_uncompress_failed ();
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  offset = (offset + 3) &~ (size_t) 3;
  if (unlikely (offset != index_offset))
    {
      elf_uncompress_failed ();
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  return 1;
}